

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O0

word ** If_ManDsdTtElems(void)

{
  int local_c;
  int v;
  
  if (If_ManDsdTtElems::pTtElems[0] == (word *)0x0) {
    for (local_c = 0; local_c < 0xd; local_c = local_c + 1) {
      If_ManDsdTtElems::pTtElems[local_c] = If_ManDsdTtElems::TtElems[local_c];
    }
    Abc_TtElemInit(If_ManDsdTtElems::pTtElems,0xc);
  }
  return If_ManDsdTtElems::pTtElems;
}

Assistant:

static inline word ** If_ManDsdTtElems()
{
    static word TtElems[DAU_MAX_VAR+1][DAU_MAX_WORD], * pTtElems[DAU_MAX_VAR+1] = {NULL};
    if ( pTtElems[0] == NULL )
    {
        int v;
        for ( v = 0; v <= DAU_MAX_VAR; v++ )
            pTtElems[v] = TtElems[v];
        Abc_TtElemInit( pTtElems, DAU_MAX_VAR );
    }
    return pTtElems;
}